

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O0

void number_suite::outer_zero_one_fail(void)

{
  bool bVar1;
  undefined4 local_194;
  value local_190 [2];
  basic_string_view<char,_std::char_traits<char>_> local_188;
  undefined4 local_178;
  value local_174 [5];
  basic_string_view<char,_std::char_traits<char>_> local_160;
  undefined1 local_150 [8];
  chunk_reader reader;
  
  trial::protocol::json::basic_chunk_reader<char>::basic_chunk_reader
            ((basic_chunk_reader<char> *)local_150);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160,"0");
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_150,&local_160);
  boost::detail::test_impl
            ("!reader.next(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x58,"void number_suite::outer_zero_one_fail()",(bool)(~bVar1 & 1));
  local_174[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_178 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x59,"void number_suite::outer_zero_one_fail()",local_174,&local_178);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"01");
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_150,&local_188);
  boost::detail::test_impl
            ("reader.next(\"01\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x5a,"void number_suite::outer_zero_one_fail()",bVar1);
  local_190[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_194 = 0xfffffffd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_invalid_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x5b,"void number_suite::outer_zero_one_fail()",local_190,&local_194);
  trial::protocol::json::basic_chunk_reader<char>::~basic_chunk_reader
            ((basic_chunk_reader<char> *)local_150);
  return;
}

Assistant:

void outer_zero_one_fail()
{
    // "01" is illegal
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(!reader.next("0"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(reader.next("01"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_invalid_value);
}